

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O1

Dim * __thiscall
dynet::Max::dim_forward
          (Dim *__return_storage_ptr__,Max *this,vector<dynet::Dim,_std::allocator<dynet::Dim>_> *xs
          )

{
  pointer __s1;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  ostream *poVar5;
  invalid_argument *this_00;
  pointer pDVar6;
  
  __s1 = (xs->super__Vector_base<dynet::Dim,_std::allocator<dynet::Dim>_>)._M_impl.
         super__Vector_impl_data._M_start;
  if ((((long)(xs->super__Vector_base<dynet::Dim,_std::allocator<dynet::Dim>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)__s1 == 0x48) && (__s1->nd == __s1[1].nd))
     && (__s1->bd == __s1[1].bd)) {
    iVar4 = bcmp(__s1,__s1 + 1,(ulong)__s1->nd);
    if (iVar4 == 0) {
      pDVar6 = __s1 + 1;
      if (__s1[1].bd <= __s1->bd) {
        pDVar6 = __s1;
      }
      __return_storage_ptr__->bd = pDVar6->bd;
      uVar1 = *(undefined8 *)(pDVar6->d + 2);
      uVar2 = *(undefined8 *)(pDVar6->d + 4);
      uVar3 = *(undefined8 *)(pDVar6->d + 6);
      *(undefined8 *)__return_storage_ptr__->d = *(undefined8 *)pDVar6->d;
      *(undefined8 *)(__return_storage_ptr__->d + 2) = uVar1;
      *(undefined8 *)(__return_storage_ptr__->d + 4) = uVar2;
      *(undefined8 *)(__return_storage_ptr__->d + 6) = uVar3;
      return __return_storage_ptr__;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Bad arguments in Max: ",0x16);
  poVar5 = operator<<((ostream *)&std::cerr,xs);
  std::endl<char,std::char_traits<char>>(poVar5);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"invalid arguments to Max");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim Max::dim_forward(const vector<Dim>& xs) const {
  if (xs.size() != 2 || xs[0] != xs[1]) {
    cerr << "Bad arguments in Max: " << xs << endl;
    throw std::invalid_argument("invalid arguments to Max");
  }
  return xs[0].bd >= xs[1].bd ? xs[0] : xs[1];
}